

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::AddActiveScriptPubKeyManWithDb
          (CWallet *this,WalletBatch *batch,uint256 id,OutputType type,bool internal)

{
  uint256 id_00;
  bool bVar1;
  runtime_error *this_00;
  undefined8 in_RSI;
  undefined1 internal_00;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff48;
  uint256 *in_stack_ffffffffffffff50;
  WalletBatch *this_01;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff6c;
  CWallet *this_02;
  string local_28 [8];
  undefined1 in_stack_ffffffffffffffe0 [24];
  long lVar3;
  
  internal_00 = (undefined1)((ulong)in_RSI >> 0x38);
  this_01 = (WalletBatch *)&stack0x00000008;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  bVar1 = WalletBatch::WriteActiveScriptPubKeyMan
                    (this_01,(uint8_t)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffff50,
                     SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  if (bVar1) {
    id_00.super_base_blob<256U>.m_data._M_elems[0x18] = (char)lVar3;
    id_00.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)lVar3 >> 8);
    id_00.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)lVar3 >> 0x10);
    id_00.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)lVar3 >> 0x18);
    id_00.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)lVar3 >> 0x20);
    id_00.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)lVar3 >> 0x28);
    id_00.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)lVar3 >> 0x30);
    id_00.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)lVar3 >> 0x38);
    id_00.super_base_blob<256U>.m_data._M_elems[0] = in_stack_ffffffffffffffe0[0];
    id_00.super_base_blob<256U>.m_data._M_elems[1] = in_stack_ffffffffffffffe0[1];
    id_00.super_base_blob<256U>.m_data._M_elems[2] = in_stack_ffffffffffffffe0[2];
    id_00.super_base_blob<256U>.m_data._M_elems[3] = in_stack_ffffffffffffffe0[3];
    id_00.super_base_blob<256U>.m_data._M_elems[4] = in_stack_ffffffffffffffe0[4];
    id_00.super_base_blob<256U>.m_data._M_elems[5] = in_stack_ffffffffffffffe0[5];
    id_00.super_base_blob<256U>.m_data._M_elems[6] = in_stack_ffffffffffffffe0[6];
    id_00.super_base_blob<256U>.m_data._M_elems[7] = in_stack_ffffffffffffffe0[7];
    id_00.super_base_blob<256U>.m_data._M_elems[8] = in_stack_ffffffffffffffe0[8];
    id_00.super_base_blob<256U>.m_data._M_elems[9] = in_stack_ffffffffffffffe0[9];
    id_00.super_base_blob<256U>.m_data._M_elems[10] = in_stack_ffffffffffffffe0[10];
    id_00.super_base_blob<256U>.m_data._M_elems[0xb] = in_stack_ffffffffffffffe0[0xb];
    id_00.super_base_blob<256U>.m_data._M_elems[0xc] = in_stack_ffffffffffffffe0[0xc];
    id_00.super_base_blob<256U>.m_data._M_elems[0xd] = in_stack_ffffffffffffffe0[0xd];
    id_00.super_base_blob<256U>.m_data._M_elems[0xe] = in_stack_ffffffffffffffe0[0xe];
    id_00.super_base_blob<256U>.m_data._M_elems[0xf] = in_stack_ffffffffffffffe0[0xf];
    id_00.super_base_blob<256U>.m_data._M_elems[0x10] = in_stack_ffffffffffffffe0[0x10];
    id_00.super_base_blob<256U>.m_data._M_elems[0x11] = in_stack_ffffffffffffffe0[0x11];
    id_00.super_base_blob<256U>.m_data._M_elems[0x12] = in_stack_ffffffffffffffe0[0x12];
    id_00.super_base_blob<256U>.m_data._M_elems[0x13] = in_stack_ffffffffffffffe0[0x13];
    id_00.super_base_blob<256U>.m_data._M_elems[0x14] = in_stack_ffffffffffffffe0[0x14];
    id_00.super_base_blob<256U>.m_data._M_elems[0x15] = in_stack_ffffffffffffffe0[0x15];
    id_00.super_base_blob<256U>.m_data._M_elems[0x16] = in_stack_ffffffffffffffe0[0x16];
    id_00.super_base_blob<256U>.m_data._M_elems[0x17] = in_stack_ffffffffffffffe0[0x17];
    LoadActiveScriptPubKeyMan
              (this_02,id_00,
               (OutputType)
               ((ulong)this_01[1].m_batch._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl >> 0x20),
               (bool)internal_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      return;
    }
  }
  else {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff68);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,uVar2),(char *)in_RDI,(allocator<char> *)this_01);
    std::operator+(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::runtime_error::runtime_error(this_00,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddActiveScriptPubKeyManWithDb(WalletBatch& batch, uint256 id, OutputType type, bool internal)
{
    if (!batch.WriteActiveScriptPubKeyMan(static_cast<uint8_t>(type), id, internal)) {
        throw std::runtime_error(std::string(__func__) + ": writing active ScriptPubKeyMan id failed");
    }
    LoadActiveScriptPubKeyMan(id, type, internal);
}